

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall
spectest::CommandRunner::ReadTextModule
          (CommandRunner *this,string_view module_filename,string *header,bool validate)

{
  bool bVar1;
  uchar *size;
  Errors *errors_00;
  pointer lexer_00;
  pointer module_00;
  pointer line_finder_00;
  string *out_data;
  string_view filename;
  string_view filename_00;
  undefined1 local_e0 [8];
  unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
  line_finder;
  undefined1 local_b5 [8];
  WastParseOptions options;
  unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> module;
  unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_> local_80;
  unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_> lexer;
  Errors errors;
  undefined1 local_50 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  bool validate_local;
  string *header_local;
  CommandRunner *this_local;
  string_view module_filename_local;
  Result result;
  
  filename_00._M_str = (wabt *)module_filename._M_len;
  out_data = header;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = validate;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  filename._M_str = local_50;
  filename._M_len = (size_t)module_filename._M_str;
  module_filename_local._M_str._4_4_ =
       wabt::ReadFile(filename_00._M_str,filename,
                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)out_data);
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::vector
            ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&lexer);
  size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  errors_00 = (Errors *)
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  filename_00._M_len = (size_t)&local_80;
  wabt::WastLexer::CreateBufferLexer(filename_00,module_filename._M_str,(size_t)size,errors_00);
  bVar1 = wabt::Succeeded(module_filename_local._M_str._4_4_);
  if (bVar1) {
    std::unique_ptr<wabt::Module,std::default_delete<wabt::Module>>::
    unique_ptr<std::default_delete<wabt::Module>,void>
              ((unique_ptr<wabt::Module,std::default_delete<wabt::Module>> *)
               &options.features.gc_enabled_);
    wabt::WastParseOptions::WastParseOptions((WastParseOptions *)local_b5,&s_features);
    lexer_00 = std::unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>::get
                         (&local_80);
    module_filename_local._M_str._4_4_ =
         wabt::ParseWatModule
                   (lexer_00,(unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)
                             &options.features.gc_enabled_,(Errors *)&lexer,
                    (WastParseOptions *)local_b5);
    if (((file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) &&
       (bVar1 = wabt::Succeeded(module_filename_local._M_str._4_4_), bVar1)) {
      module_00 = std::unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>::get
                            ((unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)
                             &options.features.gc_enabled_);
      wabt::ValidateOptions::ValidateOptions
                ((ValidateOptions *)
                 ((long)&line_finder._M_t.
                         super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
                         .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl +
                 1),&s_features);
      module_filename_local._M_str._4_4_ =
           wabt::ValidateModule
                     (module_00,(Errors *)&lexer,
                      (ValidateOptions *)
                      ((long)&line_finder._M_t.
                              super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
                              .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>.
                              _M_head_impl + 1));
    }
    std::unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>::~unique_ptr
              ((unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)
               &options.features.gc_enabled_);
  }
  std::unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>::operator->(&local_80);
  wabt::WastLexer::MakeLineFinder((WastLexer *)local_e0);
  line_finder_00 =
       std::
       unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>::
       get((unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
            *)local_e0);
  wabt::FormatErrorsToFile((Errors *)&lexer,Text,line_finder_00,_stdout,header,Once,0x50);
  std::unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>::
  ~unique_ptr((unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
               *)local_e0);
  std::unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>::~unique_ptr(&local_80);
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
            ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&lexer);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  return (Result)module_filename_local._M_str._4_4_;
}

Assistant:

wabt::Result CommandRunner::ReadTextModule(std::string_view module_filename,
                                           const std::string& header,
                                           bool validate) {
  std::vector<uint8_t> file_data;
  wabt::Result result = ReadFile(module_filename, &file_data);
  Errors errors;
  std::unique_ptr<WastLexer> lexer = WastLexer::CreateBufferLexer(
      module_filename, file_data.data(), file_data.size(), &errors);
  if (Succeeded(result)) {
    std::unique_ptr<wabt::Module> module;
    WastParseOptions options(s_features);
    result = ParseWatModule(lexer.get(), &module, &errors, &options);

    if (validate && Succeeded(result)) {
      result =
          ValidateModule(module.get(), &errors, ValidateOptions{s_features});
    }
  }

  auto line_finder = lexer->MakeLineFinder();
  FormatErrorsToFile(errors, Location::Type::Text, line_finder.get(), stdout,
                     header, PrintHeader::Once);
  return result;
}